

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# block_cache.cpp
# Opt level: O1

void __thiscall
libtorrent::block_cache::block_cache
          (block_cache *this,io_service *ios,function<void_()> *trigger_trim)

{
  undefined8 *puVar1;
  long lVar2;
  
  disk_buffer_pool::disk_buffer_pool(&this->super_disk_buffer_pool,ios,trigger_trim);
  (this->m_pieces)._M_h._M_buckets = &(this->m_pieces)._M_h._M_single_bucket;
  (this->m_pieces)._M_h._M_bucket_count = 1;
  (this->m_pieces)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->m_pieces)._M_h._M_element_count = 0;
  (this->m_pieces)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->m_pieces)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->m_pieces)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  lVar2 = 0;
  do {
    puVar1 = (undefined8 *)((long)&this->m_lru[0].m_first + lVar2);
    *puVar1 = 0;
    puVar1[1] = 0;
    *(undefined4 *)((long)&this->m_lru[0].m_size + lVar2) = 0;
    lVar2 = lVar2 + 0x18;
  } while (lVar2 != 0xa8);
  this->m_last_cache_op = 0;
  this->m_ghost_size = 8;
  this->m_max_volatile_blocks = 100;
  this->m_volatile_size = 0;
  this->m_read_cache_size = 0;
  this->m_write_cache_size = 0;
  this->m_send_buffer_blocks = 0;
  this->m_pinned_blocks = 0;
  return;
}

Assistant:

block_cache::block_cache(io_service& ios
	, std::function<void()> const& trigger_trim)
	: disk_buffer_pool(ios, trigger_trim)
	, m_last_cache_op(cache_miss)
	, m_ghost_size(8)
	, m_max_volatile_blocks(100)
	, m_volatile_size(0)
	, m_read_cache_size(0)
	, m_write_cache_size(0)
	, m_send_buffer_blocks(0)
	, m_pinned_blocks(0)
{
}